

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImGuiStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar *text_begin;
  ushort uVar1;
  unsigned_short *puVar2;
  ImFont *pIVar3;
  bool bVar4;
  float fVar5;
  int iVar6;
  ulong uVar7;
  undefined8 in_R8;
  ulong uVar8;
  float *pfVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImWchar *local_38;
  
  uVar11 = str->CurLenW;
  uVar13 = (ulong)uVar11;
  bVar4 = 0 < (int)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = 0;
    IVar14.x = 0.0;
    IVar14.y = 0.0;
    uVar7 = 0;
  }
  else {
    fVar15 = 0.0;
    uVar12 = 0;
    do {
      puVar2 = (str->TextW).Data;
      local_38 = (ImWchar *)0x0;
      iVar6 = (int)uVar12;
      text_begin = puVar2 + iVar6;
      IVar14 = InputTextCalcTextSizeW
                         (text_begin,puVar2 + str->CurLenW,&local_38,(ImVec2 *)0x1,SUB81(in_R8,0));
      uVar7 = (ulong)((long)local_38 - (long)text_begin) >> 1;
      if ((int)uVar7 < 1) {
        return uVar11;
      }
      if ((y < fVar15) && (iVar6 == 0)) {
        return 0;
      }
      fVar15 = fVar15 + IVar14.y;
      if (y < fVar15) break;
      uVar10 = iVar6 + (int)uVar7;
      uVar12 = (ulong)uVar10;
      bVar4 = (int)uVar10 < (int)uVar11;
    } while ((int)uVar10 < (int)uVar11);
  }
  if ((bVar4) && (uVar11 = (uint)uVar12, 0.0 <= x)) {
    iVar6 = (int)uVar7;
    if ((x < IVar14.x) && (0 < iVar6)) {
      fVar15 = 0.0;
      uVar8 = 0;
      do {
        uVar1 = (str->TextW).Data[uVar12 + uVar8];
        fVar17 = -1.0;
        if (uVar1 != 10) {
          pIVar3 = GImGui->Font;
          pfVar9 = &pIVar3->FallbackAdvanceX;
          if ((int)(uint)uVar1 < (pIVar3->IndexAdvanceX).Size) {
            pfVar9 = (float *)((ulong)((uint)uVar1 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
          }
          fVar17 = (GImGui->FontSize / pIVar3->FontSize) * *pfVar9;
        }
        fVar16 = fVar15 + fVar17;
        fVar5 = fVar16;
        if (x < fVar16) {
          fVar5 = fVar15;
          if (fVar17 * 0.5 + fVar15 <= x) {
            uVar13 = (ulong)(uVar11 + 1 + (int)uVar8);
          }
          else {
            uVar13 = uVar8 + uVar12;
          }
        }
        fVar15 = fVar5;
        if (x < fVar16) {
          return (int)uVar13;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar7 & 0xffffffff) != uVar8);
    }
    uVar10 = iVar6 + uVar11;
    iVar6 = iVar6 + uVar11;
    uVar11 = uVar10;
    if ((str->TextW).Data[(long)(int)uVar10 + -1] == 10) {
      uVar11 = iVar6 - 1;
    }
  }
  return uVar11;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}